

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Native_File_Chooser_GTK.cxx
# Opt level: O0

void Fl_GTK_File_Chooser::probe_for_GTK_libs(void)

{
  void *pvVar1;
  long lVar2;
  char *pc_dl_error;
  void *ptr_gtk;
  void *ptr_glib;
  
  pvVar1 = fl_dlopen("libglib-2.0.so","libglib-2.0.so.0");
  pc_dl_error = (char *)fl_dlopen("libgtk-x11-2.0.so","libgtk-x11-2.0.so.0");
  if ((pc_dl_error == (char *)0x0) || (pvVar1 == (void *)0x0)) {
    pc_dl_error = (char *)fl_dlopen("libgtk-3.so","libgtk-3.so.0");
  }
  if ((pvVar1 == (void *)0x0) || (pc_dl_error == (char *)0x0)) {
    did_find_GTK_libs = 0;
  }
  else {
    dlerror();
    fl_g_free = (XX_g_free)dlsym(pvVar1,"g_free");
    lVar2 = dlerror();
    if (lVar2 == 0) {
      dlerror();
      fl_g_slist_nth_data = (XX_g_slist_nth_data)dlsym(pvVar1,"g_slist_nth_data");
      lVar2 = dlerror();
      if (lVar2 == 0) {
        dlerror();
        fl_g_slist_length = (XX_g_slist_length)dlsym(pvVar1,"g_slist_length");
        lVar2 = dlerror();
        if (lVar2 == 0) {
          dlerror();
          fl_g_slist_free = (XX_g_slist_free)dlsym(pvVar1,"g_slist_free");
          lVar2 = dlerror();
          if (lVar2 == 0) {
            dlerror();
            fl_gtk_init_check = (XX_gtk_init_check)dlsym(pc_dl_error,"gtk_init_check");
            lVar2 = dlerror();
            if (lVar2 == 0) {
              dlerror();
              fl_gtk_widget_destroy = (XX_gtk_widget_destroy)dlsym(pc_dl_error,"gtk_widget_destroy")
              ;
              lVar2 = dlerror();
              if (lVar2 == 0) {
                dlerror();
                fl_gtk_file_chooser_set_select_multiple =
                     (XX_gtk_file_chooser_set_select_multiple)
                     dlsym(pc_dl_error,"gtk_file_chooser_set_select_multiple");
                lVar2 = dlerror();
                if (lVar2 == 0) {
                  dlerror();
                  fl_gtk_file_chooser_set_do_overwrite_confirmation =
                       (XX_gtk_file_chooser_set_do_overwrite_confirmation)
                       dlsym(pc_dl_error,"gtk_file_chooser_set_do_overwrite_confirmation");
                  lVar2 = dlerror();
                  if (lVar2 == 0) {
                    dlerror();
                    fl_gtk_file_chooser_set_current_name =
                         (XX_gtk_file_chooser_set_current_name)
                         dlsym(pc_dl_error,"gtk_file_chooser_set_current_name");
                    lVar2 = dlerror();
                    if (lVar2 == 0) {
                      dlerror();
                      fl_gtk_file_chooser_set_current_folder =
                           (XX_gtk_file_chooser_set_current_folder)
                           dlsym(pc_dl_error,"gtk_file_chooser_set_current_folder");
                      lVar2 = dlerror();
                      if (lVar2 == 0) {
                        dlerror();
                        fl_gtk_file_chooser_set_create_folders =
                             (XX_gtk_file_chooser_set_create_folders)
                             dlsym(pc_dl_error,"gtk_file_chooser_set_create_folders");
                        lVar2 = dlerror();
                        if (lVar2 == 0) {
                          dlerror();
                          fl_gtk_file_chooser_get_select_multiple =
                               (XX_gtk_file_chooser_get_select_multiple)
                               dlsym(pc_dl_error,"gtk_file_chooser_get_select_multiple");
                          lVar2 = dlerror();
                          if (lVar2 == 0) {
                            dlerror();
                            fl_gtk_widget_hide =
                                 (XX_gtk_widget_hide)dlsym(pc_dl_error,"gtk_widget_hide");
                            lVar2 = dlerror();
                            if (lVar2 == 0) {
                              dlerror();
                              fl_gtk_file_chooser_get_filename =
                                   (XX_gtk_file_chooser_get_filename)
                                   dlsym(pc_dl_error,"gtk_file_chooser_get_filename");
                              lVar2 = dlerror();
                              if (lVar2 == 0) {
                                dlerror();
                                fl_gtk_file_chooser_get_filenames =
                                     (XX_gtk_file_chooser_get_filenames)
                                     dlsym(pc_dl_error,"gtk_file_chooser_get_filenames");
                                lVar2 = dlerror();
                                if (lVar2 == 0) {
                                  dlerror();
                                  fl_gtk_main_iteration =
                                       (XX_gtk_main_iteration)
                                       dlsym(pc_dl_error,"gtk_main_iteration");
                                  lVar2 = dlerror();
                                  if (lVar2 == 0) {
                                    dlerror();
                                    fl_gtk_events_pending =
                                         (XX_gtk_events_pending)
                                         dlsym(pc_dl_error,"gtk_events_pending");
                                    lVar2 = dlerror();
                                    if (lVar2 == 0) {
                                      dlerror();
                                      fl_gtk_file_chooser_dialog_new =
                                           (XX_gtk_file_chooser_dialog_new)
                                           dlsym(pc_dl_error,"gtk_file_chooser_dialog_new");
                                      lVar2 = dlerror();
                                      if (lVar2 == 0) {
                                        dlerror();
                                        fl_gtk_file_chooser_add_filter =
                                             (XX_gtk_file_chooser_add_filter)
                                             dlsym(pc_dl_error,"gtk_file_chooser_add_filter");
                                        lVar2 = dlerror();
                                        if (lVar2 == 0) {
                                          dlerror();
                                          fl_gtk_file_chooser_get_filter =
                                               (XX_gtk_file_chooser_get_filter)
                                               dlsym(pc_dl_error,"gtk_file_chooser_get_filter");
                                          lVar2 = dlerror();
                                          if (lVar2 == 0) {
                                            dlerror();
                                            fl_gtk_file_chooser_set_filter =
                                                 (XX_gtk_file_chooser_set_filter)
                                                 dlsym(pc_dl_error,"gtk_file_chooser_set_filter");
                                            lVar2 = dlerror();
                                            if (lVar2 == 0) {
                                              dlerror();
                                              fl_gtk_file_filter_new =
                                                   (XX_gtk_file_filter_new)
                                                   dlsym(pc_dl_error,"gtk_file_filter_new");
                                              lVar2 = dlerror();
                                              if (lVar2 == 0) {
                                                dlerror();
                                                fl_gtk_file_filter_add_pattern =
                                                     (XX_gtk_file_filter_add_pattern)
                                                     dlsym(pc_dl_error,"gtk_file_filter_add_pattern"
                                                          );
                                                lVar2 = dlerror();
                                                if (lVar2 == 0) {
                                                  dlerror();
                                                  fl_gtk_file_filter_add_custom =
                                                       (XX_gtk_file_filter_add_custom)
                                                       dlsym(pc_dl_error,
                                                             "gtk_file_filter_add_custom");
                                                  lVar2 = dlerror();
                                                  if (lVar2 == 0) {
                                                    dlerror();
                                                    fl_gtk_file_filter_set_name =
                                                         (XX_gtk_file_filter_set_name)
                                                         dlsym(pc_dl_error,
                                                               "gtk_file_filter_set_name");
                                                    lVar2 = dlerror();
                                                    if (lVar2 == 0) {
                                                      dlerror();
                                                      fl_gtk_file_filter_get_name =
                                                           (XX_gtk_file_filter_get_name)
                                                           dlsym(pc_dl_error,
                                                                 "gtk_file_filter_get_name");
                                                      lVar2 = dlerror();
                                                      if (lVar2 == 0) {
                                                        dlerror();
                                                        fl_gtk_file_chooser_set_extra_widget =
                                                             (XX_gtk_file_chooser_set_extra_widget)
                                                             dlsym(pc_dl_error,
                                                                                                                                      
                                                  "gtk_file_chooser_set_extra_widget");
                                                  lVar2 = dlerror();
                                                  if (lVar2 == 0) {
                                                    dlerror();
                                                    fl_gtk_widget_show_now =
                                                         (XX_gtk_widget_show_now)
                                                         dlsym(pc_dl_error,"gtk_widget_show_now");
                                                    lVar2 = dlerror();
                                                    if (lVar2 == 0) {
                                                      dlerror();
                                                      fl_gtk_widget_get_window =
                                                           (XX_gtk_widget_get_window)
                                                           dlsym(pc_dl_error,"gtk_widget_get_window"
                                                                );
                                                      lVar2 = dlerror();
                                                      if (lVar2 == 0) {
                                                        dlerror();
                                                        fl_gdk_x11_drawable_get_xid =
                                                             (XX_gdk_x11_drawable_get_xid)
                                                             dlsym(pc_dl_error,
                                                                   "gdk_x11_drawable_get_xid");
                                                        lVar2 = dlerror();
                                                        if (lVar2 == 0) {
                                                          dlerror();
                                                          fl_gtk_check_button_new_with_label =
                                                               (XX_gtk_check_button_new_with_label)
                                                               dlsym(pc_dl_error,
                                                                                                                                          
                                                  "gtk_check_button_new_with_label");
                                                  lVar2 = dlerror();
                                                  if (lVar2 == 0) {
                                                    dlerror();
                                                    fl_g_signal_connect_data =
                                                         (XX_g_signal_connect_data)
                                                         dlsym(pc_dl_error,"g_signal_connect_data");
                                                    lVar2 = dlerror();
                                                    if (lVar2 == 0) {
                                                      dlerror();
                                                      fl_gtk_toggle_button_get_active =
                                                           (XX_gtk_toggle_button_get_active)
                                                           dlsym(pc_dl_error,
                                                                 "gtk_toggle_button_get_active");
                                                      lVar2 = dlerror();
                                                      if (lVar2 == 0) {
                                                        dlerror();
                                                        fl_gtk_file_chooser_set_show_hidden =
                                                             (XX_gtk_file_chooser_set_show_hidden)
                                                             dlsym(pc_dl_error,
                                                                                                                                      
                                                  "gtk_file_chooser_set_show_hidden");
                                                  lVar2 = dlerror();
                                                  if (lVar2 == 0) {
                                                    dlerror();
                                                    fl_gtk_file_chooser_get_show_hidden =
                                                         (XX_gtk_file_chooser_get_show_hidden)
                                                         dlsym(pc_dl_error,
                                                               "gtk_file_chooser_get_show_hidden");
                                                    lVar2 = dlerror();
                                                    if (lVar2 == 0) {
                                                      dlerror();
                                                      fl_gtk_toggle_button_set_active =
                                                           (XX_gtk_toggle_button_set_active)
                                                           dlsym(pc_dl_error,
                                                                 "gtk_toggle_button_set_active");
                                                      lVar2 = dlerror();
                                                      if (lVar2 == 0) {
                                                        did_find_GTK_libs = 1;
                                                      }
                                                      else {
                                                        fprintf(_stderr,"%s\n",lVar2);
                                                        did_find_GTK_libs = 0;
                                                      }
                                                    }
                                                    else {
                                                      fprintf(_stderr,"%s\n",lVar2);
                                                      did_find_GTK_libs = 0;
                                                    }
                                                  }
                                                  else {
                                                    fprintf(_stderr,"%s\n",lVar2);
                                                    did_find_GTK_libs = 0;
                                                  }
                                                  }
                                                  else {
                                                    fprintf(_stderr,"%s\n",lVar2);
                                                    did_find_GTK_libs = 0;
                                                  }
                                                  }
                                                  else {
                                                    fprintf(_stderr,"%s\n",lVar2);
                                                    did_find_GTK_libs = 0;
                                                  }
                                                  }
                                                  else {
                                                    fprintf(_stderr,"%s\n",lVar2);
                                                    did_find_GTK_libs = 0;
                                                  }
                                                  }
                                                  else {
                                                    fprintf(_stderr,"%s\n",lVar2);
                                                    did_find_GTK_libs = 0;
                                                  }
                                                  }
                                                  else {
                                                    fprintf(_stderr,"%s\n",lVar2);
                                                    did_find_GTK_libs = 0;
                                                  }
                                                  }
                                                  else {
                                                    fprintf(_stderr,"%s\n",lVar2);
                                                    did_find_GTK_libs = 0;
                                                  }
                                                  }
                                                  else {
                                                    fprintf(_stderr,"%s\n",lVar2);
                                                    did_find_GTK_libs = 0;
                                                  }
                                                  }
                                                  else {
                                                    fprintf(_stderr,"%s\n",lVar2);
                                                    did_find_GTK_libs = 0;
                                                  }
                                                  }
                                                  else {
                                                    fprintf(_stderr,"%s\n",lVar2);
                                                    did_find_GTK_libs = 0;
                                                  }
                                                  }
                                                  else {
                                                    fprintf(_stderr,"%s\n",lVar2);
                                                    did_find_GTK_libs = 0;
                                                  }
                                                }
                                                else {
                                                  fprintf(_stderr,"%s\n",lVar2);
                                                  did_find_GTK_libs = 0;
                                                }
                                              }
                                              else {
                                                fprintf(_stderr,"%s\n",lVar2);
                                                did_find_GTK_libs = 0;
                                              }
                                            }
                                            else {
                                              fprintf(_stderr,"%s\n",lVar2);
                                              did_find_GTK_libs = 0;
                                            }
                                          }
                                          else {
                                            fprintf(_stderr,"%s\n",lVar2);
                                            did_find_GTK_libs = 0;
                                          }
                                        }
                                        else {
                                          fprintf(_stderr,"%s\n",lVar2);
                                          did_find_GTK_libs = 0;
                                        }
                                      }
                                      else {
                                        fprintf(_stderr,"%s\n",lVar2);
                                        did_find_GTK_libs = 0;
                                      }
                                    }
                                    else {
                                      fprintf(_stderr,"%s\n",lVar2);
                                      did_find_GTK_libs = 0;
                                    }
                                  }
                                  else {
                                    fprintf(_stderr,"%s\n",lVar2);
                                    did_find_GTK_libs = 0;
                                  }
                                }
                                else {
                                  fprintf(_stderr,"%s\n",lVar2);
                                  did_find_GTK_libs = 0;
                                }
                              }
                              else {
                                fprintf(_stderr,"%s\n",lVar2);
                                did_find_GTK_libs = 0;
                              }
                            }
                            else {
                              fprintf(_stderr,"%s\n",lVar2);
                              did_find_GTK_libs = 0;
                            }
                          }
                          else {
                            fprintf(_stderr,"%s\n",lVar2);
                            did_find_GTK_libs = 0;
                          }
                        }
                        else {
                          fprintf(_stderr,"%s\n",lVar2);
                          did_find_GTK_libs = 0;
                        }
                      }
                      else {
                        fprintf(_stderr,"%s\n",lVar2);
                        did_find_GTK_libs = 0;
                      }
                    }
                    else {
                      fprintf(_stderr,"%s\n",lVar2);
                      did_find_GTK_libs = 0;
                    }
                  }
                  else {
                    fprintf(_stderr,"%s\n",lVar2);
                    did_find_GTK_libs = 0;
                  }
                }
                else {
                  fprintf(_stderr,"%s\n",lVar2);
                  did_find_GTK_libs = 0;
                }
              }
              else {
                fprintf(_stderr,"%s\n",lVar2);
                did_find_GTK_libs = 0;
              }
            }
            else {
              fprintf(_stderr,"%s\n",lVar2);
              did_find_GTK_libs = 0;
            }
          }
          else {
            fprintf(_stderr,"%s\n",lVar2);
            did_find_GTK_libs = 0;
          }
        }
        else {
          fprintf(_stderr,"%s\n",lVar2);
          did_find_GTK_libs = 0;
        }
      }
      else {
        fprintf(_stderr,"%s\n",lVar2);
        did_find_GTK_libs = 0;
      }
    }
    else {
      fprintf(_stderr,"%s\n",lVar2);
      did_find_GTK_libs = 0;
    }
  }
  return;
}

Assistant:

void Fl_GTK_File_Chooser::probe_for_GTK_libs(void) {
#if HAVE_DLSYM && HAVE_DLFCN_H
  void *ptr_glib    = NULL;
  void *ptr_gtk     = NULL;
  
#   ifdef __APPLE_CC__ // allows testing on Darwin + X11
  ptr_glib    = dlopen("/sw/lib/libglib-2.0.dylib", RTLD_LAZY | RTLD_GLOBAL);
#   else
  ptr_glib    = fl_dlopen("libglib-2.0.so", "libglib-2.0.so.0");
#   endif
  // Try first with GTK2
#   ifdef __APPLE_CC__ // allows testing on Darwin + X11
  ptr_gtk     = dlopen("/sw/lib/libgtk-x11-2.0.dylib", RTLD_LAZY | RTLD_GLOBAL);
#else
  ptr_gtk     = fl_dlopen("libgtk-x11-2.0.so", "libgtk-x11-2.0.so.0");
#endif
  if (ptr_gtk && ptr_glib) {
#ifdef DEBUG
    puts("selected GTK-2\n");
#endif
  }
  else {// Try then with GTK3
    ptr_gtk     = fl_dlopen("libgtk-3.so", "libgtk-3.so.0");
#ifdef DEBUG
    if (ptr_gtk && ptr_glib) {
      puts("selected GTK-3\n");
    }
#endif
  }
  
  if((!ptr_glib) || (!ptr_gtk)) {
#ifdef DEBUG
    puts("Failure to load libglib or libgtk");
#endif
    did_find_GTK_libs = 0;
    return;
  }
  
  char *pc_dl_error; // used to report errors by the GET_SYM macro...
  // items we need from GLib
  GET_SYM(g_free, ptr_glib);
  GET_SYM(g_slist_nth_data, ptr_glib);
  GET_SYM(g_slist_length, ptr_glib);
  GET_SYM(g_slist_free, ptr_glib);
  // items we need from GTK
  GET_SYM(gtk_init_check, ptr_gtk);
  GET_SYM(gtk_widget_destroy, ptr_gtk);
  GET_SYM(gtk_file_chooser_set_select_multiple, ptr_gtk);
  GET_SYM(gtk_file_chooser_set_do_overwrite_confirmation, ptr_gtk);
  GET_SYM(gtk_file_chooser_set_current_name, ptr_gtk);
  GET_SYM(gtk_file_chooser_set_current_folder, ptr_gtk);
  GET_SYM(gtk_file_chooser_set_create_folders, ptr_gtk);
  GET_SYM(gtk_file_chooser_get_select_multiple, ptr_gtk);
  GET_SYM(gtk_widget_hide, ptr_gtk);
  GET_SYM(gtk_file_chooser_get_filename, ptr_gtk);
  GET_SYM(gtk_file_chooser_get_filenames, ptr_gtk);
  GET_SYM(gtk_main_iteration, ptr_gtk);
  GET_SYM(gtk_events_pending, ptr_gtk);
  GET_SYM(gtk_file_chooser_dialog_new, ptr_gtk);
  GET_SYM(gtk_file_chooser_add_filter, ptr_gtk);
  GET_SYM(gtk_file_chooser_get_filter, ptr_gtk);
  GET_SYM(gtk_file_chooser_set_filter, ptr_gtk);
  GET_SYM(gtk_file_filter_new, ptr_gtk);
  GET_SYM(gtk_file_filter_add_pattern, ptr_gtk);
  GET_SYM(gtk_file_filter_add_custom, ptr_gtk);
  GET_SYM(gtk_file_filter_set_name, ptr_gtk);
  GET_SYM(gtk_file_filter_get_name, ptr_gtk);
  GET_SYM(gtk_file_chooser_set_extra_widget, ptr_gtk);
  GET_SYM(gtk_widget_show_now, ptr_gtk);
  GET_SYM(gtk_widget_get_window, ptr_gtk);
  GET_SYM(gdk_x11_drawable_get_xid, ptr_gtk);
  GET_SYM(gtk_check_button_new_with_label, ptr_gtk);
  GET_SYM(g_signal_connect_data, ptr_gtk);
  GET_SYM(gtk_toggle_button_get_active, ptr_gtk);
  GET_SYM(gtk_file_chooser_set_show_hidden, ptr_gtk);
  GET_SYM(gtk_file_chooser_get_show_hidden, ptr_gtk);
  GET_SYM(gtk_toggle_button_set_active, ptr_gtk);
  
  did_find_GTK_libs = 1;
#endif
}